

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Roboteq.h
# Opt level: O1

int ConnectRoboteq(ROBOTEQ *pRoboteq,char *szCfgFilePath)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  FILE *__stream;
  char *pcVar6;
  size_t sVar7;
  ulong uVar8;
  char line [256];
  char response [256];
  char local_2a8;
  char local_2a7;
  int *local_1a8;
  int *local_1a0;
  int *local_198;
  int *local_190;
  int *local_188;
  int *local_180;
  int *local_178;
  int *local_170;
  int *local_168;
  int *local_160;
  double *local_158;
  double *local_150;
  double *local_148;
  double *local_140;
  char local_138 [264];
  
  memset(pRoboteq->szCfgFilePath,0,0x100);
  sprintf(pRoboteq->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar4 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar4 != 0) {
    memset(&local_2a8,0,0x100);
    memset(pRoboteq->szDevPath + 5,0,0xfb);
    builtin_strncpy(pRoboteq->szDevPath,"COM1",5);
    pRoboteq->BaudRate = 0x2580;
    pRoboteq->timeout = 1000;
    pRoboteq->threadperiod = 100;
    pRoboteq->bSaveRawData = 1;
    pRoboteq->bEcho = 1;
    lVar5 = -0xc;
    do {
      *(undefined4 *)((long)pRoboteq->MidPWs + lVar5) = 1000;
      *(undefined4 *)((long)pRoboteq->MaxPWs + lVar5) = 0x5dc;
      *(undefined4 *)((long)pRoboteq->InitPWs + lVar5) = 2000;
      *(undefined4 *)((long)pRoboteq->ThresholdPWs + lVar5) = 0x5dc;
      *(undefined4 *)((long)pRoboteq->CoefPWs + lVar5 + -4) = 0;
      *(undefined8 *)((long)pRoboteq->bProportionalPWs + lVar5 * 2) = 0x3ff0000000000000;
      *(undefined4 *)((long)pRoboteq->analoginputoffset + lVar5 + -4) = 1;
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0);
    pRoboteq->analoginputthreshold[6] = 0.0;
    pRoboteq->analoginputthreshold[7] = 0.0;
    pRoboteq->analoginputthreshold[4] = 0.0;
    pRoboteq->analoginputthreshold[5] = 0.0;
    pRoboteq->analoginputthreshold[2] = 0.0;
    pRoboteq->analoginputthreshold[3] = 0.0;
    pRoboteq->analoginputthreshold[0] = 0.0;
    pRoboteq->analoginputthreshold[1] = 0.0;
    pRoboteq->analoginputoffset[6] = 0.0;
    pRoboteq->analoginputoffset[7] = 0.0;
    pRoboteq->analoginputoffset[4] = 0.0;
    pRoboteq->analoginputoffset[5] = 0.0;
    pRoboteq->analoginputoffset[2] = 0.0;
    pRoboteq->analoginputoffset[3] = 0.0;
    pRoboteq->analoginputoffset[0] = 0.0;
    pRoboteq->analoginputoffset[1] = 0.0;
    lVar5 = -8;
    do {
      pRoboteq->analoginputx[lVar5] = 1.0;
      pRoboteq->analoginputy[lVar5] = 0.0;
      pRoboteq->analoginputz[lVar5] = 0.0;
      pRoboteq->analoginputphi[lVar5] = 0.0;
      pRoboteq->analoginputtheta[lVar5] = 0.0;
      pRoboteq->analoginputpsi[lVar5] = 0.0;
      pRoboteq->analoginputmin[lVar5] = 0.0;
      pRoboteq->analoginputmax[lVar5] = 0.0;
      pRoboteq->analoginputmax[lVar5 + 8] = 0.0;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0);
    pRoboteq->rudderchan = 2;
    pRoboteq->rightthrusterchan = 1;
    pRoboteq->leftthrusterchan = 0;
    pRoboteq->vbat1analoginputchan = -1;
    pRoboteq->ibat1analoginputchan = -1;
    pRoboteq->vbat2analoginputchan = -1;
    pRoboteq->ibat2analoginputchan = -1;
    pRoboteq->ibat2analoginputchan = -1;
    pRoboteq->vbat3analoginputchan = -1;
    pRoboteq->ibat3analoginputchan = -1;
    pRoboteq->switchanaloginputchan = -1;
    __stream = fopen(szCfgFilePath,"r");
    if (__stream == (FILE *)0x0) {
      pcVar6 = "Configuration file not found.";
    }
    else {
      local_1a8 = &pRoboteq->rudderchan;
      local_1a0 = &pRoboteq->rightthrusterchan;
      local_198 = &pRoboteq->leftthrusterchan;
      local_190 = &pRoboteq->vbat1analoginputchan;
      local_188 = &pRoboteq->ibat1analoginputchan;
      local_180 = &pRoboteq->vbat2analoginputchan;
      local_178 = &pRoboteq->ibat2analoginputchan;
      local_170 = &pRoboteq->vbat3analoginputchan;
      local_168 = &pRoboteq->ibat3analoginputchan;
      local_160 = &pRoboteq->switchanaloginputchan;
      do {
        while ((pcVar6 = fgets(&local_2a8,0x100,__stream), local_2a8 != '#' && (local_2a8 != '%')))
        {
          if ((local_2a8 != '/') || ((pcVar6 == (char *)0x0 || (local_2a7 != '/'))))
          goto LAB_001ac4bb;
        }
      } while (pcVar6 != (char *)0x0);
LAB_001ac4bb:
      if (pcVar6 == (char *)0x0 || local_2a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(&local_2a8,"%255s",pRoboteq->szDevPath);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar6 = fgets(&local_2a8,0x100,__stream), local_2a8 != '#' && (local_2a8 != '%')))
        {
          if ((local_2a8 != '/') || ((pcVar6 == (char *)0x0 || (local_2a7 != '/'))))
          goto LAB_001ac53a;
        }
      } while (pcVar6 != (char *)0x0);
LAB_001ac53a:
      if (pcVar6 == (char *)0x0 || local_2a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(&local_2a8,"%d",&pRoboteq->BaudRate);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar6 = fgets(&local_2a8,0x100,__stream), local_2a8 != '#' && (local_2a8 != '%')))
        {
          if ((local_2a8 != '/') || ((pcVar6 == (char *)0x0 || (local_2a7 != '/'))))
          goto LAB_001ac5b9;
        }
      } while (pcVar6 != (char *)0x0);
LAB_001ac5b9:
      if (pcVar6 == (char *)0x0 || local_2a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(&local_2a8,"%d",&pRoboteq->timeout);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar6 = fgets(&local_2a8,0x100,__stream), local_2a8 != '#' && (local_2a8 != '%')))
        {
          if ((local_2a8 != '/') || ((pcVar6 == (char *)0x0 || (local_2a7 != '/'))))
          goto LAB_001ac638;
        }
      } while (pcVar6 != (char *)0x0);
LAB_001ac638:
      if (pcVar6 == (char *)0x0 || local_2a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(&local_2a8,"%d",&pRoboteq->threadperiod);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar6 = fgets(&local_2a8,0x100,__stream), local_2a8 != '#' && (local_2a8 != '%')))
        {
          if ((local_2a8 != '/') || ((pcVar6 == (char *)0x0 || (local_2a7 != '/'))))
          goto LAB_001ac6b9;
        }
      } while (pcVar6 != (char *)0x0);
LAB_001ac6b9:
      if (pcVar6 == (char *)0x0 || local_2a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(&local_2a8,"%d",&pRoboteq->bSaveRawData);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar6 = fgets(&local_2a8,0x100,__stream), local_2a8 != '#' && (local_2a8 != '%')))
        {
          if ((local_2a8 != '/') || ((pcVar6 == (char *)0x0 || (local_2a7 != '/'))))
          goto LAB_001ac73a;
        }
      } while (pcVar6 != (char *)0x0);
LAB_001ac73a:
      if (pcVar6 == (char *)0x0 || local_2a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(&local_2a8,"%d",&pRoboteq->bEcho);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      lVar5 = 0;
LAB_001ac7e9:
      do {
        pcVar6 = fgets(&local_2a8,0x100,__stream);
        if ((local_2a8 == '#') || (local_2a8 == '%')) {
          if (pcVar6 != (char *)0x0) goto LAB_001ac7e9;
        }
        else if (((local_2a8 == '/') && (pcVar6 != (char *)0x0)) && (local_2a7 == '/'))
        goto LAB_001ac7e9;
        if (pcVar6 == (char *)0x0 || local_2a8 == '$') {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(&local_2a8,"%d",pRoboteq->MinPWs + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        do {
          while ((pcVar6 = fgets(&local_2a8,0x100,__stream), local_2a8 != '#' && (local_2a8 != '%'))
                ) {
            if ((local_2a8 != '/') || ((pcVar6 == (char *)0x0 || (local_2a7 != '/'))))
            goto LAB_001ac892;
          }
        } while (pcVar6 != (char *)0x0);
LAB_001ac892:
        if (pcVar6 == (char *)0x0 || local_2a8 == '$') {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(&local_2a8,"%d",pRoboteq->MidPWs + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        do {
          while ((pcVar6 = fgets(&local_2a8,0x100,__stream), local_2a8 != '#' && (local_2a8 != '%'))
                ) {
            if ((local_2a8 != '/') || ((pcVar6 == (char *)0x0 || (local_2a7 != '/'))))
            goto LAB_001ac904;
          }
        } while (pcVar6 != (char *)0x0);
LAB_001ac904:
        if (pcVar6 == (char *)0x0 || local_2a8 == '$') {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(&local_2a8,"%d",pRoboteq->MaxPWs + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        do {
          while ((pcVar6 = fgets(&local_2a8,0x100,__stream), local_2a8 != '#' && (local_2a8 != '%'))
                ) {
            if ((local_2a8 != '/') || ((pcVar6 == (char *)0x0 || (local_2a7 != '/'))))
            goto LAB_001ac976;
          }
        } while (pcVar6 != (char *)0x0);
LAB_001ac976:
        if (pcVar6 == (char *)0x0 || local_2a8 == '$') {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(&local_2a8,"%d",pRoboteq->InitPWs + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        do {
          while ((pcVar6 = fgets(&local_2a8,0x100,__stream), local_2a8 != '#' && (local_2a8 != '%'))
                ) {
            if ((local_2a8 != '/') || ((pcVar6 == (char *)0x0 || (local_2a7 != '/'))))
            goto LAB_001ac9e8;
          }
        } while (pcVar6 != (char *)0x0);
LAB_001ac9e8:
        if (pcVar6 == (char *)0x0 || local_2a8 == '$') {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(&local_2a8,"%d",pRoboteq->ThresholdPWs + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        do {
          while ((pcVar6 = fgets(&local_2a8,0x100,__stream), local_2a8 != '#' && (local_2a8 != '%'))
                ) {
            if ((local_2a8 != '/') || ((pcVar6 == (char *)0x0 || (local_2a7 != '/'))))
            goto LAB_001aca5a;
          }
        } while (pcVar6 != (char *)0x0);
LAB_001aca5a:
        if (pcVar6 == (char *)0x0 || local_2a8 == '$') {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(&local_2a8,"%lf",pRoboteq->CoefPWs + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        do {
          while ((pcVar6 = fgets(&local_2a8,0x100,__stream), local_2a8 != '#' && (local_2a8 != '%'))
                ) {
            if ((local_2a8 != '/') || ((pcVar6 == (char *)0x0 || (local_2a7 != '/'))))
            goto LAB_001acad0;
          }
        } while (pcVar6 != (char *)0x0);
LAB_001acad0:
        if (pcVar6 == (char *)0x0 || local_2a8 == '$') {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(&local_2a8,"%d",pRoboteq->bProportionalPWs + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      local_140 = pRoboteq->analoginputtheta;
      local_148 = pRoboteq->analoginputpsi;
      local_150 = pRoboteq->analoginputmin;
      local_158 = pRoboteq->analoginputmax;
      lVar5 = 0;
LAB_001acbbe:
      do {
        pcVar6 = fgets(&local_2a8,0x100,__stream);
        if ((local_2a8 == '#') || (local_2a8 == '%')) {
          if (pcVar6 != (char *)0x0) goto LAB_001acbbe;
        }
        else if (((local_2a8 == '/') && (pcVar6 != (char *)0x0)) && (local_2a7 == '/'))
        goto LAB_001acbbe;
        if (pcVar6 == (char *)0x0 || local_2a8 == '$') {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(&local_2a8,"%lf",pRoboteq->analoginputoffset + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        do {
          while ((pcVar6 = fgets(&local_2a8,0x100,__stream), local_2a8 != '#' && (local_2a8 != '%'))
                ) {
            if ((local_2a8 != '/') || ((pcVar6 == (char *)0x0 || (local_2a7 != '/'))))
            goto LAB_001acc67;
          }
        } while (pcVar6 != (char *)0x0);
LAB_001acc67:
        if (pcVar6 == (char *)0x0 || local_2a8 == '$') {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(&local_2a8,"%lf",pRoboteq->analoginputthreshold + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        do {
          while ((pcVar6 = fgets(&local_2a8,0x100,__stream), local_2a8 != '#' && (local_2a8 != '%'))
                ) {
            if ((local_2a8 != '/') || ((pcVar6 == (char *)0x0 || (local_2a7 != '/'))))
            goto LAB_001accd9;
          }
        } while (pcVar6 != (char *)0x0);
LAB_001accd9:
        if (pcVar6 == (char *)0x0 || local_2a8 == '$') {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(&local_2a8,"%lf",pRoboteq->analoginputcoef + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        do {
          while ((pcVar6 = fgets(&local_2a8,0x100,__stream), local_2a8 != '#' && (local_2a8 != '%'))
                ) {
            if ((local_2a8 != '/') || ((pcVar6 == (char *)0x0 || (local_2a7 != '/'))))
            goto LAB_001acd4b;
          }
        } while (pcVar6 != (char *)0x0);
LAB_001acd4b:
        if (pcVar6 == (char *)0x0 || local_2a8 == '$') {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(&local_2a8,"%lf",pRoboteq->analoginputx + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        do {
          while ((pcVar6 = fgets(&local_2a8,0x100,__stream), local_2a8 != '#' && (local_2a8 != '%'))
                ) {
            if ((local_2a8 != '/') || ((pcVar6 == (char *)0x0 || (local_2a7 != '/'))))
            goto LAB_001acdbd;
          }
        } while (pcVar6 != (char *)0x0);
LAB_001acdbd:
        if (pcVar6 == (char *)0x0 || local_2a8 == '$') {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(&local_2a8,"%lf",pRoboteq->analoginputy + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        do {
          while ((pcVar6 = fgets(&local_2a8,0x100,__stream), local_2a8 != '#' && (local_2a8 != '%'))
                ) {
            if ((local_2a8 != '/') || ((pcVar6 == (char *)0x0 || (local_2a7 != '/'))))
            goto LAB_001ace2f;
          }
        } while (pcVar6 != (char *)0x0);
LAB_001ace2f:
        if (pcVar6 == (char *)0x0 || local_2a8 == '$') {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(&local_2a8,"%lf",pRoboteq->analoginputz + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        do {
          while ((pcVar6 = fgets(&local_2a8,0x100,__stream), local_2a8 != '#' && (local_2a8 != '%'))
                ) {
            if ((local_2a8 != '/') || ((pcVar6 == (char *)0x0 || (local_2a7 != '/'))))
            goto LAB_001acea1;
          }
        } while (pcVar6 != (char *)0x0);
LAB_001acea1:
        if (pcVar6 == (char *)0x0 || local_2a8 == '$') {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(&local_2a8,"%lf",pRoboteq->analoginputphi + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        do {
          while ((pcVar6 = fgets(&local_2a8,0x100,__stream), local_2a8 != '#' && (local_2a8 != '%'))
                ) {
            if ((local_2a8 != '/') || ((pcVar6 == (char *)0x0 || (local_2a7 != '/'))))
            goto LAB_001acf13;
          }
        } while (pcVar6 != (char *)0x0);
LAB_001acf13:
        if (pcVar6 == (char *)0x0 || local_2a8 == '$') {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(&local_2a8,"%lf",local_140 + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        do {
          while ((pcVar6 = fgets(&local_2a8,0x100,__stream), local_2a8 != '#' && (local_2a8 != '%'))
                ) {
            if ((local_2a8 != '/') || ((pcVar6 == (char *)0x0 || (local_2a7 != '/'))))
            goto LAB_001acf88;
          }
        } while (pcVar6 != (char *)0x0);
LAB_001acf88:
        if (pcVar6 == (char *)0x0 || local_2a8 == '$') {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(&local_2a8,"%lf",local_148 + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        do {
          while ((pcVar6 = fgets(&local_2a8,0x100,__stream), local_2a8 != '#' && (local_2a8 != '%'))
                ) {
            if ((local_2a8 != '/') || ((pcVar6 == (char *)0x0 || (local_2a7 != '/'))))
            goto LAB_001acffd;
          }
        } while (pcVar6 != (char *)0x0);
LAB_001acffd:
        if (pcVar6 == (char *)0x0 || local_2a8 == '$') {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(&local_2a8,"%lf",local_150 + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        do {
          while ((pcVar6 = fgets(&local_2a8,0x100,__stream), local_2a8 != '#' && (local_2a8 != '%'))
                ) {
            if ((local_2a8 != '/') || ((pcVar6 == (char *)0x0 || (local_2a7 != '/'))))
            goto LAB_001ad072;
          }
        } while (pcVar6 != (char *)0x0);
LAB_001ad072:
        if (pcVar6 == (char *)0x0 || local_2a8 == '$') {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(&local_2a8,"%lf",local_158 + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 8);
      do {
        while ((pcVar6 = fgets(&local_2a8,0x100,__stream), local_2a8 != '#' && (local_2a8 != '%')))
        {
          if ((local_2a8 != '/') || ((pcVar6 == (char *)0x0 || (local_2a7 != '/'))))
          goto LAB_001ad103;
        }
      } while (pcVar6 != (char *)0x0);
LAB_001ad103:
      if (pcVar6 == (char *)0x0 || local_2a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(&local_2a8,"%d",local_1a8);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar6 = fgets(&local_2a8,0x100,__stream), local_2a8 != '#' && (local_2a8 != '%')))
        {
          if ((local_2a8 != '/') || ((pcVar6 == (char *)0x0 || (local_2a7 != '/'))))
          goto LAB_001ad187;
        }
      } while (pcVar6 != (char *)0x0);
LAB_001ad187:
      if (pcVar6 == (char *)0x0 || local_2a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(&local_2a8,"%d",local_1a0);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar6 = fgets(&local_2a8,0x100,__stream), local_2a8 != '#' && (local_2a8 != '%')))
        {
          if ((local_2a8 != '/') || ((pcVar6 == (char *)0x0 || (local_2a7 != '/'))))
          goto LAB_001ad20b;
        }
      } while (pcVar6 != (char *)0x0);
LAB_001ad20b:
      if (pcVar6 == (char *)0x0 || local_2a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(&local_2a8,"%d",local_198);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar6 = fgets(&local_2a8,0x100,__stream), local_2a8 != '#' && (local_2a8 != '%')))
        {
          if ((local_2a8 != '/') || ((pcVar6 == (char *)0x0 || (local_2a7 != '/'))))
          goto LAB_001ad28f;
        }
      } while (pcVar6 != (char *)0x0);
LAB_001ad28f:
      if (pcVar6 == (char *)0x0 || local_2a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(&local_2a8,"%d",local_190);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar6 = fgets(&local_2a8,0x100,__stream), local_2a8 != '#' && (local_2a8 != '%')))
        {
          if ((local_2a8 != '/') || ((pcVar6 == (char *)0x0 || (local_2a7 != '/'))))
          goto LAB_001ad313;
        }
      } while (pcVar6 != (char *)0x0);
LAB_001ad313:
      if (pcVar6 == (char *)0x0 || local_2a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(&local_2a8,"%d",local_188);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar6 = fgets(&local_2a8,0x100,__stream), local_2a8 != '#' && (local_2a8 != '%')))
        {
          if ((local_2a8 != '/') || ((pcVar6 == (char *)0x0 || (local_2a7 != '/'))))
          goto LAB_001ad397;
        }
      } while (pcVar6 != (char *)0x0);
LAB_001ad397:
      if (pcVar6 == (char *)0x0 || local_2a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(&local_2a8,"%d",local_180);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar6 = fgets(&local_2a8,0x100,__stream), local_2a8 != '#' && (local_2a8 != '%')))
        {
          if ((local_2a8 != '/') || ((pcVar6 == (char *)0x0 || (local_2a7 != '/'))))
          goto LAB_001ad41b;
        }
      } while (pcVar6 != (char *)0x0);
LAB_001ad41b:
      if (pcVar6 == (char *)0x0 || local_2a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(&local_2a8,"%d",local_178);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar6 = fgets(&local_2a8,0x100,__stream), local_2a8 != '#' && (local_2a8 != '%')))
        {
          if ((local_2a8 != '/') || ((pcVar6 == (char *)0x0 || (local_2a7 != '/'))))
          goto LAB_001ad49f;
        }
      } while (pcVar6 != (char *)0x0);
LAB_001ad49f:
      if (pcVar6 == (char *)0x0 || local_2a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(&local_2a8,"%d",local_170);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar6 = fgets(&local_2a8,0x100,__stream), local_2a8 != '#' && (local_2a8 != '%')))
        {
          if ((local_2a8 != '/') || ((pcVar6 == (char *)0x0 || (local_2a7 != '/'))))
          goto LAB_001ad523;
        }
      } while (pcVar6 != (char *)0x0);
LAB_001ad523:
      if (pcVar6 == (char *)0x0 || local_2a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(&local_2a8,"%d",local_168);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar6 = fgets(&local_2a8,0x100,__stream), local_2a8 != '#' && (local_2a8 != '%')))
        {
          if ((local_2a8 != '/') || ((pcVar6 == (char *)0x0 || (local_2a7 != '/'))))
          goto LAB_001ad5a7;
        }
      } while (pcVar6 != (char *)0x0);
LAB_001ad5a7:
      if (pcVar6 == (char *)0x0 || local_2a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(&local_2a8,"%d",local_160);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      iVar4 = fclose(__stream);
      if (iVar4 == 0) goto LAB_001ad610;
      pcVar6 = "fclose() failed.";
    }
    puts(pcVar6);
  }
LAB_001ad610:
  if (pRoboteq->threadperiod < 0) {
    puts("Invalid parameter : threadperiod.");
    pRoboteq->threadperiod = 100;
  }
  uVar8 = 0;
  do {
    iVar4 = pRoboteq->MinPWs[uVar8];
    if (((iVar4 - 0x9c5U < 0xfffff82f) ||
        (iVar1 = pRoboteq->MidPWs[uVar8], iVar1 - 0x9c5U < 0xfffff82f)) ||
       (iVar2 = pRoboteq->MaxPWs[uVar8], iVar2 - 0x9c5U < 0xfffff82f)) {
LAB_001ad680:
      printf("Invalid parameters : PWM channel %d.\n",uVar8 & 0xffffffff);
      pRoboteq->MinPWs[uVar8] = 1000;
      pRoboteq->MidPWs[uVar8] = 0x5dc;
      pRoboteq->MaxPWs[uVar8] = 2000;
      pRoboteq->InitPWs[uVar8] = 0x5dc;
      pRoboteq->ThresholdPWs[uVar8] = 0;
      pRoboteq->CoefPWs[uVar8] = 1.0;
      pRoboteq->bProportionalPWs[uVar8] = 1;
    }
    else {
      iVar3 = pRoboteq->InitPWs[uVar8];
      if (iVar3 != 0) {
        if (((iVar1 <= iVar2) && (iVar4 <= iVar1)) &&
           ((iVar3 <= iVar2 && ((iVar4 <= iVar3 && (0xfffff82e < iVar3 - 0x9c5U))))))
        goto LAB_001ad725;
        goto LAB_001ad680;
      }
      if (iVar2 < iVar1 || iVar1 < iVar4) goto LAB_001ad680;
LAB_001ad725:
      if (pRoboteq->ThresholdPWs[uVar8] < 0) goto LAB_001ad680;
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 != 3);
  pRoboteq->LastPWs[2] = 0;
  pRoboteq->LastPWs[0] = 0;
  pRoboteq->LastPWs[1] = 0;
  pRoboteq->LastAIs[0] = 0;
  pRoboteq->LastAIs[1] = 0;
  pRoboteq->LastAIs[2] = 0;
  pRoboteq->LastAIs[3] = 0;
  pRoboteq->LastAIs[4] = 0;
  pRoboteq->LastAIs[5] = 0;
  pRoboteq->LastAIs[6] = 0;
  pRoboteq->LastAIs[7] = 0;
  if (2 < (uint)pRoboteq->rudderchan) {
    puts("Invalid parameter : rudderchan.");
    pRoboteq->rudderchan = 2;
  }
  if (2 < (uint)pRoboteq->rightthrusterchan) {
    puts("Invalid parameter : rightthrusterchan.");
    pRoboteq->rightthrusterchan = 1;
  }
  if (2 < (uint)pRoboteq->leftthrusterchan) {
    puts("Invalid parameter : leftthrusterchan.");
    pRoboteq->leftthrusterchan = 0;
  }
  if (pRoboteq->vbat1analoginputchan - 8U < 0xfffffff7) {
    puts("Invalid parameter : vbat1analoginputchan.");
    pRoboteq->vbat1analoginputchan = -1;
  }
  if (pRoboteq->ibat1analoginputchan - 8U < 0xfffffff7) {
    puts("Invalid parameter : ibat1analoginputchan.");
    pRoboteq->ibat1analoginputchan = -1;
  }
  if (pRoboteq->vbat2analoginputchan - 8U < 0xfffffff7) {
    puts("Invalid parameter : vbat2analoginputchan.");
    pRoboteq->vbat2analoginputchan = -1;
  }
  if (pRoboteq->ibat2analoginputchan - 8U < 0xfffffff7) {
    puts("Invalid parameter : ibat2analoginputchan.");
    pRoboteq->ibat2analoginputchan = -1;
  }
  if (pRoboteq->vbat3analoginputchan - 8U < 0xfffffff7) {
    puts("Invalid parameter : vbat3analoginputchan.");
    pRoboteq->vbat3analoginputchan = -1;
  }
  if (pRoboteq->ibat3analoginputchan - 8U < 0xfffffff7) {
    puts("Invalid parameter : ibat3analoginputchan.");
    pRoboteq->ibat3analoginputchan = -1;
  }
  if (pRoboteq->switchanaloginputchan - 8U < 0xfffffff7) {
    puts("Invalid parameter : switchanaloginputchan.");
    pRoboteq->switchanaloginputchan = -1;
  }
  iVar4 = OpenRS232Port(&pRoboteq->RS232Port,pRoboteq->szDevPath);
  if (iVar4 != 0) {
    puts("Unable to connect to a Roboteq.");
    return 1;
  }
  iVar4 = (pRoboteq->RS232Port).DevType;
  if (3 < iVar4 - 1U) {
    if ((iVar4 != 0) ||
       (iVar4 = SetOptionsComputerRS232Port
                          ((pRoboteq->RS232Port).hDev,pRoboteq->BaudRate,'\0',0,'\b','\0',
                           pRoboteq->timeout), iVar4 != 0)) {
      pcVar6 = "Unable to connect to a Roboteq.";
      goto LAB_001ad95b;
    }
    tcflush(*(int *)&(pRoboteq->RS232Port).hDev,2);
  }
  iVar4 = IssueCommandRoboteq(pRoboteq,"?","FID","",10,local_138,0);
  if (iVar4 == 0) {
    sVar7 = strlen(local_138);
    if (sVar7 < 0xc) {
      puts("Warning : A Roboteq has an unrecognized version.");
    }
    puts("Roboteq connected.");
    return 0;
  }
  pcVar6 = "Unable to connect to a Roboteq : FID failure.";
LAB_001ad95b:
  puts(pcVar6);
  CloseRS232Port(&pRoboteq->RS232Port);
  return 1;
}

Assistant:

inline int ConnectRoboteq(ROBOTEQ* pRoboteq, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];
	int channel = 0;
	char response[256];

	memset(pRoboteq->szCfgFilePath, 0, sizeof(pRoboteq->szCfgFilePath));
	sprintf(pRoboteq->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pRoboteq->szDevPath, 0, sizeof(pRoboteq->szDevPath));
		sprintf(pRoboteq->szDevPath, "COM1");
		pRoboteq->BaudRate = 9600;
		pRoboteq->timeout = 1000;
		pRoboteq->threadperiod = 100;
		pRoboteq->bSaveRawData = 1;
		pRoboteq->bEcho = 1;
		for (channel = 0; channel < NB_CHANNELS_PWM_ROBOTEQ; channel++)
		{
			pRoboteq->MinPWs[channel] = 1000;
			pRoboteq->MidPWs[channel] = 1500;
			pRoboteq->MaxPWs[channel] = 2000;
			pRoboteq->InitPWs[channel] = 1500;
			pRoboteq->ThresholdPWs[channel] = 0;
			pRoboteq->CoefPWs[channel] = 1;
			pRoboteq->bProportionalPWs[channel] = 1;
		}
		for (channel = 0; channel < NB_CHANNELS_AI_ROBOTEQ; channel++)
		{
			pRoboteq->analoginputoffset[channel] = 0;
			pRoboteq->analoginputthreshold[channel] = 0;
			pRoboteq->analoginputcoef[channel] = 1;
			pRoboteq->analoginputx[channel] = 0;
			pRoboteq->analoginputy[channel] = 0;
			pRoboteq->analoginputz[channel] = 0;
			pRoboteq->analoginputphi[channel] = 0;
			pRoboteq->analoginputtheta[channel] = 0;
			pRoboteq->analoginputpsi[channel] = 0;
			pRoboteq->analoginputmin[channel] = 0;
			pRoboteq->analoginputmax[channel] = 0;
		}
		pRoboteq->rudderchan = 2;
		pRoboteq->rightthrusterchan = 1;
		pRoboteq->leftthrusterchan = 0;
		pRoboteq->vbat1analoginputchan = -1;
		pRoboteq->ibat1analoginputchan = -1;
		pRoboteq->vbat2analoginputchan = -1;
		pRoboteq->ibat2analoginputchan = -1;
		pRoboteq->vbat3analoginputchan = -1;
		pRoboteq->ibat3analoginputchan = -1;
		pRoboteq->switchanaloginputchan = -1;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pRoboteq->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->bEcho) != 1) printf("Invalid configuration file.\n");

			for (channel = 0; channel < NB_CHANNELS_PWM_ROBOTEQ; channel++)
			{
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pRoboteq->MinPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pRoboteq->MidPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pRoboteq->MaxPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pRoboteq->InitPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pRoboteq->ThresholdPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->CoefPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pRoboteq->bProportionalPWs[channel]) != 1) printf("Invalid configuration file.\n");
			}

			for (channel = 0; channel < NB_CHANNELS_AI_ROBOTEQ; channel++)
			{
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputoffset[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputthreshold[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputcoef[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputx[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputy[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputz[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputphi[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputtheta[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputpsi[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputmin[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputmax[channel]) != 1) printf("Invalid configuration file.\n");
			}

			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->rudderchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->rightthrusterchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->leftthrusterchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->vbat1analoginputchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->ibat1analoginputchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->vbat2analoginputchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->ibat2analoginputchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->vbat3analoginputchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->ibat3analoginputchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->switchanaloginputchan) != 1) printf("Invalid configuration file.\n");

			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pRoboteq->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pRoboteq->threadperiod = 100;
	}

	for (channel = 0; channel < NB_CHANNELS_PWM_ROBOTEQ; channel++)
	{
		if (
			(pRoboteq->MinPWs[channel] < DEFAULT_ABSOLUTE_MIN_PW_ROBOTEQ)||(pRoboteq->MinPWs[channel] > DEFAULT_ABSOLUTE_MAX_PW_ROBOTEQ)||
			(pRoboteq->MidPWs[channel] < DEFAULT_ABSOLUTE_MIN_PW_ROBOTEQ)||(pRoboteq->MidPWs[channel] > DEFAULT_ABSOLUTE_MAX_PW_ROBOTEQ)||
			(pRoboteq->MaxPWs[channel] < DEFAULT_ABSOLUTE_MIN_PW_ROBOTEQ)||(pRoboteq->MaxPWs[channel] > DEFAULT_ABSOLUTE_MAX_PW_ROBOTEQ)
			||(
			(pRoboteq->InitPWs[channel] != 0)&&
			((pRoboteq->InitPWs[channel] < DEFAULT_ABSOLUTE_MIN_PW_ROBOTEQ)||(pRoboteq->InitPWs[channel] > DEFAULT_ABSOLUTE_MAX_PW_ROBOTEQ)||
			(pRoboteq->MinPWs[channel] > pRoboteq->InitPWs[channel])||(pRoboteq->InitPWs[channel] > pRoboteq->MaxPWs[channel]))			
			)||
			(pRoboteq->MinPWs[channel] > pRoboteq->MidPWs[channel])||(pRoboteq->MidPWs[channel] > pRoboteq->MaxPWs[channel])||
			(pRoboteq->ThresholdPWs[channel] < 0)
			)
		{
			printf("Invalid parameters : PWM channel %d.\n", channel);
			pRoboteq->MinPWs[channel] = 1000;
			pRoboteq->MidPWs[channel] = 1500;
			pRoboteq->MaxPWs[channel] = 2000;
			pRoboteq->InitPWs[channel] = 1500;
			pRoboteq->ThresholdPWs[channel] = 0;
			pRoboteq->CoefPWs[channel] = 1;
			pRoboteq->bProportionalPWs[channel] = 1;
		}
	}

	// Used to save raw data, should be handled specifically...
	//pRoboteq->pfSaveFile = NULL;

	for (channel = 0; channel < NB_CHANNELS_PWM_ROBOTEQ; channel++)
	{
		pRoboteq->LastPWs[channel] = 0;
	}

	for (channel = 0; channel < NB_CHANNELS_AI_ROBOTEQ; channel++)
	{
		pRoboteq->LastAIs[channel] = 0;
	}

	if ((pRoboteq->rudderchan < 0)||(pRoboteq->rudderchan >= NB_CHANNELS_PWM_ROBOTEQ))
	{
		printf("Invalid parameter : rudderchan.\n");
		pRoboteq->rudderchan = 2;
	}
	if ((pRoboteq->rightthrusterchan < 0)||(pRoboteq->rightthrusterchan >= NB_CHANNELS_PWM_ROBOTEQ))
	{
		printf("Invalid parameter : rightthrusterchan.\n");
		pRoboteq->rightthrusterchan = 1;
	}
	if ((pRoboteq->leftthrusterchan < 0)||(pRoboteq->leftthrusterchan >= NB_CHANNELS_PWM_ROBOTEQ))
	{
		printf("Invalid parameter : leftthrusterchan.\n");
		pRoboteq->leftthrusterchan = 0;
	}

	if ((pRoboteq->vbat1analoginputchan < -1)||(pRoboteq->vbat1analoginputchan >= NB_CHANNELS_AI_ROBOTEQ))
	{
		printf("Invalid parameter : vbat1analoginputchan.\n");
		pRoboteq->vbat1analoginputchan = -1;
	}
	if ((pRoboteq->ibat1analoginputchan < -1)||(pRoboteq->ibat1analoginputchan >= NB_CHANNELS_AI_ROBOTEQ))
	{
		printf("Invalid parameter : ibat1analoginputchan.\n");
		pRoboteq->ibat1analoginputchan = -1;
	}
	if ((pRoboteq->vbat2analoginputchan < -1)||(pRoboteq->vbat2analoginputchan >= NB_CHANNELS_AI_ROBOTEQ))
	{
		printf("Invalid parameter : vbat2analoginputchan.\n");
		pRoboteq->vbat2analoginputchan = -1;
	}
	if ((pRoboteq->ibat2analoginputchan < -1)||(pRoboteq->ibat2analoginputchan >= NB_CHANNELS_AI_ROBOTEQ))
	{
		printf("Invalid parameter : ibat2analoginputchan.\n");
		pRoboteq->ibat2analoginputchan = -1;
	}
	if ((pRoboteq->vbat3analoginputchan < -1)||(pRoboteq->vbat3analoginputchan >= NB_CHANNELS_AI_ROBOTEQ))
	{
		printf("Invalid parameter : vbat3analoginputchan.\n");
		pRoboteq->vbat3analoginputchan = -1;
	}
	if ((pRoboteq->ibat3analoginputchan < -1)||(pRoboteq->ibat3analoginputchan >= NB_CHANNELS_AI_ROBOTEQ))
	{
		printf("Invalid parameter : ibat3analoginputchan.\n");
		pRoboteq->ibat3analoginputchan = -1;
	}
	if ((pRoboteq->switchanaloginputchan < -1)||(pRoboteq->switchanaloginputchan >= NB_CHANNELS_AI_ROBOTEQ))
	{
		printf("Invalid parameter : switchanaloginputchan.\n");
		pRoboteq->switchanaloginputchan = -1;
	}

	if (OpenRS232Port(&pRoboteq->RS232Port, pRoboteq->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Roboteq.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pRoboteq->RS232Port, pRoboteq->BaudRate, NOPARITY, FALSE, 8,
		ONESTOPBIT, (UINT)pRoboteq->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Roboteq.\n");
		CloseRS232Port(&pRoboteq->RS232Port);
		return EXIT_FAILURE;
	}

	if (IssueCommandRoboteq(pRoboteq, "?", "FID", "", 10, response, FALSE) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Roboteq : FID failure.\n");
		CloseRS232Port(&pRoboteq->RS232Port);
		return EXIT_FAILURE;
	}
	if (strlen(response) < 12)
	{
		printf("Warning : A Roboteq has an unrecognized version.\n");
	}

	printf("Roboteq connected.\n");

	return EXIT_SUCCESS;
}